

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O0

void __thiscall blockfilter_tests::blockfilter_type_names::test_method(blockfilter_type_names *this)

{
  bool bVar1;
  string *psVar2;
  long in_FS_OFFSET;
  BlockFilterType filter_type;
  char *in_stack_fffffffffffffc88;
  lazy_ostream *in_stack_fffffffffffffc90;
  assertion_result *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  BlockFilterType in_stack_fffffffffffffcaf;
  lazy_ostream *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  const_string *in_stack_fffffffffffffcc0;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffcc8;
  allocator<char> *__a;
  char *in_stack_fffffffffffffcd0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  lazy_ostream local_228 [2];
  undefined1 local_201 [25];
  char local_1e8 [8];
  allocator<char> local_1d8 [23];
  lazy_ostream local_1c1;
  undefined1 local_1b0 [64];
  const_string local_170 [2];
  lazy_ostream local_150 [2];
  allocator<char> local_129;
  assertion_result local_128 [2];
  undefined1 local_e9;
  undefined1 local_e8 [16];
  undefined1 local_d8 [64];
  undefined1 local_98 [16];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (const_string *)in_stack_fffffffffffffcb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc90,(char (*) [1])in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    psVar2 = BlockFilterTypeName_abi_cxx11_(in_stack_fffffffffffffcaf);
    in_stack_fffffffffffffc98 = (assertion_result *)0x1d21d3e;
    in_stack_fffffffffffffc90 = (lazy_ostream *)0x1d21b15;
    in_stack_fffffffffffffc88 = "BlockFilterTypeName(BlockFilterType::BASIC)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_88,local_98,0xb5,1,2,psVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (const_string *)in_stack_fffffffffffffcb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc90,(char (*) [1])in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    psVar2 = BlockFilterTypeName_abi_cxx11_(in_stack_fffffffffffffcaf);
    in_stack_fffffffffffffc98 = (assertion_result *)0x1bb4f63;
    in_stack_fffffffffffffc90 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffffc88 = "BlockFilterTypeName(static_cast<BlockFilterType>(255))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_d8,local_e8,0xb6,1,2,psVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (const_string *)in_stack_fffffffffffffcb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    BlockFilterTypeByName(in_stack_fffffffffffffca0,(BlockFilterType *)in_stack_fffffffffffffc98);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc98,SUB81((ulong)in_stack_fffffffffffffc90 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc90,(basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    in_stack_fffffffffffffc88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_128,local_150,local_170,0xb9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc88);
    std::allocator<char>::~allocator(&local_129);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (const_string *)in_stack_fffffffffffffcb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc90,(char (*) [1])in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    local_1c1._vptr_lazy_ostream._0_1_ = 0;
    in_stack_fffffffffffffc98 = (assertion_result *)0x1bc1243;
    in_stack_fffffffffffffc90 = &local_1c1;
    in_stack_fffffffffffffc88 = "filter_type";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,BlockFilterType,BlockFilterType>
              (local_1b0,(undefined1 *)((long)&local_1c1._vptr_lazy_ostream + 1),0xba,1,2,&local_e9)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __a = local_1d8;
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    __s = local_1e8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,
               CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               (const_string *)in_stack_fffffffffffffcb0);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
    in_stack_fffffffffffffcbf =
         BlockFilterTypeByName
                   (in_stack_fffffffffffffca0,(BlockFilterType *)in_stack_fffffffffffffc98);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc98,SUB81((ulong)in_stack_fffffffffffffc90 >> 0x38,0));
    in_stack_fffffffffffffcb0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc90,(basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    in_stack_fffffffffffffc88 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_201 + 1),local_228,
               (const_string *)&stack0xfffffffffffffdb8,0xbc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc88);
    std::allocator<char>::~allocator((allocator<char> *)local_201);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilter_type_names)
{
    BOOST_CHECK_EQUAL(BlockFilterTypeName(BlockFilterType::BASIC), "basic");
    BOOST_CHECK_EQUAL(BlockFilterTypeName(static_cast<BlockFilterType>(255)), "");

    BlockFilterType filter_type;
    BOOST_CHECK(BlockFilterTypeByName("basic", filter_type));
    BOOST_CHECK_EQUAL(filter_type, BlockFilterType::BASIC);

    BOOST_CHECK(!BlockFilterTypeByName("unknown", filter_type));
}